

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_work_thread
          (disp_data_source_t *this,mbox_t *mbox,agent_t *agent,
          work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
          *wt)

{
  char *pcVar1;
  ostream *poVar2;
  string local_208 [32];
  undefined1 local_1e8 [8];
  prefix_t wt_prefix;
  ostringstream local_1a0 [8];
  ostringstream ss;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
  *wt_local;
  agent_t *agent_local;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar1 = stats::prefix_t::c_str(&this->m_base_prefix);
  poVar2 = std::operator<<((ostream *)local_1a0,pcVar1);
  poVar2 = std::operator<<(poVar2,"/wt-");
  details::ios_helpers::pointer::pointer((pointer *)(wt_prefix.m_value + 0x28),agent);
  details::ios_helpers::operator<<(poVar2,(pointer *)(wt_prefix.m_value + 0x28));
  std::__cxx11::ostringstream::str();
  stats::prefix_t::prefix_t((prefix_t *)local_1e8,local_208);
  std::__cxx11::string::~string((string *)local_208);
  impl::(anonymous_namespace)::
  send_demands_count_stats<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>
            (mbox,(prefix_t *)local_1e8,wt);
  anon_unknown_7::send_thread_activity_stats(mbox,(prefix_t *)local_1e8,wt);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void
				distribute_value_for_work_thread(
					const mbox_t & mbox,
					const agent_t * agent,
					WORK_THREAD & wt )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/wt-"
								<< so_5::disp::reuse::ios_helpers::pointer{ agent };

						const stats::prefix_t wt_prefix{ ss.str() };

						send_demands_count_stats( mbox, wt_prefix, wt );
						send_thread_activity_stats( mbox, wt_prefix, wt );
					}